

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

bool test_match_object(Am_Object *object,Am_Value_List *slots_and_values_used)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Am_Slot_Key key;
  Am_Assoc as;
  Am_Value target_v;
  Am_Value object_v;
  Am_Object local_48;
  Am_Object proto;
  
  as.data = (Am_Assoc_Data *)0x0;
  key.value = 0;
  object_v.type = 0;
  object_v.value.wrapper_value = (Am_Wrapper *)0x0;
  target_v.type = 0;
  target_v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(slots_and_values_used);
  while (bVar1 = Am_Value_List::Last(slots_and_values_used), !bVar1) {
    pAVar3 = Am_Value_List::Get(slots_and_values_used);
    Am_Assoc::operator=(&as,pAVar3);
    Am_Assoc::Value_1((Am_Assoc *)&proto);
    Am_Am_Slot_Key::operator=(&key,(Am_Value *)&proto);
    Am_Value::~Am_Value((Am_Value *)&proto);
    Am_Assoc::Value_2((Am_Assoc *)&proto);
    Am_Value::operator=(&target_v,(Am_Value *)&proto);
    Am_Value::~Am_Value((Am_Value *)&proto);
    if (key.value == 0xb) {
      Am_Object::Am_Object(&proto,&target_v);
      Am_Object::Am_Object(&local_48,&proto);
      bVar2 = Am_Object::Is_Instance_Of(object,&local_48);
      Am_Object::~Am_Object(&local_48);
      Am_Object::~Am_Object(&proto);
      if (!bVar2) break;
    }
    else {
      pAVar3 = Am_Object::Get(object,key.value,1);
      Am_Value::operator=(&object_v,pAVar3);
      bVar2 = Am_Value::Exists(&object_v);
      if ((!bVar2) || (bVar2 = Am_Value::operator!=(&object_v,&target_v), bVar2)) break;
    }
    Am_Value_List::Next(slots_and_values_used);
  }
  Am_Value::~Am_Value(&target_v);
  Am_Value::~Am_Value(&object_v);
  Am_Assoc::~Am_Assoc(&as);
  return bVar1;
}

Assistant:

void
set_slots_and_values(Am_Object &fake_start_object,
                     Am_Value_List &slots_and_values_used)
{
  Am_Assoc as;
  Am_Slot_Key key;
  Am_Value target_v;
  Am_Value_List just_slots;
  for (slots_and_values_used.Start(); !slots_and_values_used.Last();
       slots_and_values_used.Next()) {
    as = slots_and_values_used.Get();
    key = Am_Am_Slot_Key(as.Value_1());
    target_v = as.Value_2();
    fake_start_object.Set(key, target_v, Am_OK_IF_NOT_THERE);
    just_slots.Add((int)key);
  }
  fake_start_object.Set(Am_SLOTS_TO_SAVE, just_slots, Am_OK_IF_NOT_THERE);
}